

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O2

void __thiscall IRT::Label::Label(Label *this)

{
  int __val;
  string local_38;
  
  __val = counter_;
  counter_ = counter_ + 1;
  std::__cxx11::to_string(&local_38,__val);
  std::operator+(&this->label_,"L",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

IRT::Label::Label(): label_("L" + std::to_string(counter_++)) {
}